

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_block.cpp
# Opt level: O0

int CfdInitializeBlockHandle(void *handle,int network_type,char *block_hex,void **block_handle)

{
  undefined1 uVar1;
  NetType NVar2;
  undefined8 uVar3;
  long in_RCX;
  char *in_RDX;
  CfdException *except;
  exception *std_except;
  bool is_bitcoin;
  CfdCapiBlockData *buffer;
  int result;
  string *in_stack_fffffffffffffe50;
  string *message;
  undefined8 in_stack_fffffffffffffe58;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffe60;
  undefined7 in_stack_fffffffffffffe98;
  undefined8 in_stack_fffffffffffffea0;
  int network_type_00;
  undefined1 local_139 [53];
  uint32_t in_stack_fffffffffffffefc;
  string *in_stack_ffffffffffffff00;
  allocator local_e9;
  string local_e8 [38];
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  void *local_38;
  undefined4 local_2c;
  long local_28;
  char *local_20;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe58 >> 0x20);
  network_type_00 = (int)((ulong)in_stack_fffffffffffffea0 >> 0x20);
  local_2c = 0xffffffff;
  local_38 = (void *)0x0;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  if (local_28 == 0) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_block.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x54;
    local_60.funcname = "CfdInitializeBlockHandle";
    cfd::core::logger::warn<>(&local_60,"block_handle is null.");
    local_82 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Failed to parameter. block_handle is null.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe60,error_code,in_stack_fffffffffffffe50);
    local_82 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  uVar1 = cfd::capi::IsEmptyString(local_20);
  if ((bool)uVar1) {
    local_a0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_block.cpp"
                 ,0x2f);
    local_a0.filename = local_a0.filename + 1;
    local_a0.line = 0x5a;
    local_a0.funcname = "CfdInitializeBlockHandle";
    cfd::core::logger::warn<>(&local_a0,"block_hex is null or empty.");
    local_c2 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,"Failed to parameter. block_hex is null or empty.",&local_c1);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe60,error_code,in_stack_fffffffffffffe50);
    local_c2 = 0;
    __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,"BlockOpe",&local_e9);
  local_38 = cfd::capi::AllocBuffer(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  NVar2 = cfd::capi::ConvertNetType
                    (network_type_00,(bool *)CONCAT17(uVar1,in_stack_fffffffffffffe98));
  *(NetType *)((long)local_38 + 0x10) = NVar2;
  uVar3 = __cxa_allocate_exception(0x30);
  message = (string *)local_139;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_139 + 1),"Elements is not supported.",(allocator *)message);
  cfd::core::CfdException::CfdException(in_stack_fffffffffffffe60,error_code,message);
  __cxa_throw(uVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdInitializeBlockHandle(
    void* handle, int network_type, const char* block_hex,
    void** block_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  CfdCapiBlockData* buffer = nullptr;
  try {
    cfd::Initialize();
    if (block_handle == nullptr) {
      warn(CFD_LOG_SOURCE, "block_handle is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. block_handle is null.");
    }
    if (IsEmptyString(block_hex)) {
      warn(CFD_LOG_SOURCE, "block_hex is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. block_hex is null or empty.");
    }

    buffer = static_cast<CfdCapiBlockData*>(
        AllocBuffer(kPrefixBlock, sizeof(CfdCapiBlockData)));

    bool is_bitcoin = false;
    buffer->net_type = ConvertNetType(network_type, &is_bitcoin);
    if (is_bitcoin) {
      buffer->block = new Block(std::string(block_hex));
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    *block_handle = buffer;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  if (buffer != nullptr) CfdFreeBlockHandle(handle, buffer);
  return result;
}